

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall
fasttext::Dictionary::getSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  pointer piVar1;
  iterator __position;
  size_t __n;
  int32_t iVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  int32_t i;
  int local_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = find(this,word);
  iVar3 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  piVar1 = (ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_74 = iVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(substrings);
  if (-1 < iVar3) {
    __position._M_current =
         (ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)ngrams,__position,&local_74);
      iVar3 = local_74;
    }
    else {
      *__position._M_current = iVar3;
      (ngrams->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(substrings,
                &(this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3].word);
  }
  __n = word->_M_string_length;
  if (__n == DAT_00139f68) {
    if (__n == 0) {
      return;
    }
    iVar3 = bcmp((word->_M_dataplus)._M_p,EOS_abi_cxx11_,__n);
    if (iVar3 == 0) {
      return;
    }
  }
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &BOW_abi_cxx11_,word);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_50,EOW_abi_cxx11_);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  computeSubwords(this,&local_70,ngrams,substrings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Dictionary::getSubwords(
		const std::string& word,
		std::vector<int32_t>& ngrams,
		std::vector<std::string>& substrings) const {
	int32_t i = getId(word);
	ngrams.clear();
	substrings.clear();
	if (i >= 0) {
		ngrams.push_back(i);
		substrings.push_back(words_[i].word);
	}
	if (word != EOS) {
		computeSubwords(BOW + word + EOW, ngrams, &substrings);
	}
}